

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O0

LOs __thiscall
Omega_h::form_new_conn(Omega_h *this,Dist *new_ents2old_owners,Dist *old_owners2new_uses)

{
  LO LVar1;
  void *extraout_RDX;
  LOs LVar2;
  Write<int> local_2d0;
  Read<int> local_2c0;
  LOs local_2b0;
  undefined1 local_2a0 [8];
  Dist serv_uses2new_uses;
  type f;
  string local_1a8 [32];
  undefined1 local_188 [8];
  Write<int> serv_uses2new_idxs;
  undefined1 local_170 [4];
  LO nold_owners;
  LOs old_owners2serv_ents;
  LOs old_owners2serv_uses;
  undefined1 local_148 [4];
  LO nserv_uses;
  Read<int> serv_uses2ranks;
  Read<int> serv_ents2ranks;
  Dist old_owners2new_ents;
  allocator local_81;
  string local_80 [32];
  Read<int> local_60;
  undefined1 local_50 [8];
  Read<int> serv_ents2new_idxs;
  LO nnew_ents;
  Dist *old_owners2new_uses_local;
  Dist *new_ents2old_owners_local;
  
  LVar1 = Dist::nitems(new_ents2old_owners);
  serv_ents2new_idxs.write_.shared_alloc_.direct_ptr._4_4_ = LVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Read<int>::Read(&local_60,LVar1,0,1,(string *)local_80);
  Dist::exch<int>((Dist *)local_50,(Read<int> *)new_ents2old_owners,(Int)&local_60);
  Read<int>::~Read(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Dist::invert((Dist *)&serv_ents2ranks.write_.shared_alloc_.direct_ptr,new_ents2old_owners);
  Dist::items2ranks((Dist *)&serv_uses2ranks.write_.shared_alloc_.direct_ptr);
  Dist::items2ranks((Dist *)local_148);
  LVar1 = Dist::nitems(old_owners2new_uses);
  Dist::roots2items((Dist *)&old_owners2serv_ents.write_.shared_alloc_.direct_ptr);
  Dist::roots2items((Dist *)local_170);
  serv_uses2new_idxs.shared_alloc_.direct_ptr._4_4_ =
       Dist::nroots((Dist *)&serv_ents2ranks.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,"",(allocator *)((long)&f.serv_uses2new_idxs.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_188,LVar1,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.serv_uses2new_idxs.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)
                  &serv_uses2new_uses.comm_[1].
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (Read<int> *)local_170);
  Read<int>::Read((Read<int> *)&f.old_owners2serv_ents.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&old_owners2serv_ents.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.old_owners2serv_uses.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_148);
  Read<int>::Read((Read<int> *)&f.serv_uses2ranks.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&serv_uses2ranks.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.serv_ents2ranks.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_50);
  Write<int>::Write((Write<int> *)&f.serv_ents2new_idxs.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_188);
  parallel_for<Omega_h::form_new_conn(Omega_h::Dist,Omega_h::Dist)::__0>
            (serv_uses2new_idxs.shared_alloc_.direct_ptr._4_4_,
             (type *)&serv_uses2new_uses.comm_[1].
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "form_new_conn");
  Dist::Dist((Dist *)local_2a0,old_owners2new_uses);
  local_2b0.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_2b0.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Dist::set_roots2items((Dist *)local_2a0,&local_2b0);
  Read<int>::~Read(&local_2b0);
  Write<int>::Write(&local_2d0,(Write<int> *)local_188);
  Read<int>::Read(&local_2c0,&local_2d0);
  Dist::exch<int>((Dist *)this,(Read<int> *)local_2a0,(Int)&local_2c0);
  Read<int>::~Read(&local_2c0);
  Write<int>::~Write(&local_2d0);
  Dist::~Dist((Dist *)local_2a0);
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0
            ((__0 *)&serv_uses2new_uses.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Write<int>::~Write((Write<int> *)local_188);
  Read<int>::~Read((Read<int> *)local_170);
  Read<int>::~Read((Read<int> *)&old_owners2serv_ents.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_148);
  Read<int>::~Read((Read<int> *)&serv_uses2ranks.write_.shared_alloc_.direct_ptr);
  Dist::~Dist((Dist *)&serv_ents2ranks.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_50);
  LVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar2.write_.shared_alloc_;
}

Assistant:

LOs form_new_conn(Dist new_ents2old_owners, Dist old_owners2new_uses) {
  auto nnew_ents = new_ents2old_owners.nitems();
  auto serv_ents2new_idxs = new_ents2old_owners.exch(LOs(nnew_ents, 0, 1), 1);
  auto old_owners2new_ents = new_ents2old_owners.invert();
  auto serv_ents2ranks = old_owners2new_ents.items2ranks();
  auto serv_uses2ranks = old_owners2new_uses.items2ranks();
  auto nserv_uses = old_owners2new_uses.nitems();
  auto old_owners2serv_uses = old_owners2new_uses.roots2items();
  auto old_owners2serv_ents = old_owners2new_ents.roots2items();
  auto nold_owners = old_owners2new_ents.nroots();
  Write<LO> serv_uses2new_idxs(nserv_uses);
  auto f = OMEGA_H_LAMBDA(LO old_owner) {
    auto ebegin = old_owners2serv_ents[old_owner];
    auto eend = old_owners2serv_ents[old_owner + 1];
    auto ubegin = old_owners2serv_uses[old_owner];
    auto uend = old_owners2serv_uses[old_owner + 1];
    for (auto serv_use = ubegin; serv_use < uend; ++serv_use) {
      auto rank = serv_uses2ranks[serv_use];
      LO idx = -1;
      for (auto e = ebegin; e < eend; ++e) {
        if (serv_ents2ranks[e] == rank) {
          idx = serv_ents2new_idxs[e];
          break;
        }
      }
      serv_uses2new_idxs[serv_use] = idx;
    }
  };
  parallel_for(nold_owners, f, "form_new_conn");
  auto serv_uses2new_uses = old_owners2new_uses;
  serv_uses2new_uses.set_roots2items(LOs());
  return serv_uses2new_uses.exch(LOs(serv_uses2new_idxs), 1);
}